

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

size_t __thiscall
ninx::parser::element::Block::__add_late_call
          (Block *this,
          unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
          *descriptor)

{
  pointer __p;
  __uniq_ptr_impl<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  *this_00;
  size_t segment_position;
  size_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_40 = (long)(this->__output_segments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->__output_segments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->__output_segments,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  this_00 = (__uniq_ptr_impl<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
             *)std::
               map<unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>_>_>_>
               ::operator[](&this->__late_calls,&local_40);
  __p = (descriptor->_M_t).
        super___uniq_ptr_impl<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::util::LateCallDescriptor_*,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
        .super__Head_base<0UL,_ninx::parser::util::LateCallDescriptor_*,_false>._M_head_impl;
  (descriptor->_M_t).
  super___uniq_ptr_impl<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::util::LateCallDescriptor_*,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  .super__Head_base<0UL,_ninx::parser::util::LateCallDescriptor_*,_false>._M_head_impl =
       (LateCallDescriptor *)0x0;
  std::
  __uniq_ptr_impl<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  ::reset(this_00,__p);
  return local_40;
}

Assistant:

size_t ninx::parser::element::Block::__add_late_call(std::unique_ptr<ninx::parser::util::LateCallDescriptor> descriptor) {
    size_t segment_position = __output_segments.size();

    // Add an empty string
    __output_segments.push_back(std::move(std::string()));

    // Add the late call reference
    __late_calls[segment_position] = std::move(descriptor);

    return segment_position;
}